

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<true,_false,_true>::push_block_(DaTrie<true,_false,_true> *this)

{
  uint uVar1;
  uint uVar2;
  value_type *__x;
  long in_RDI;
  uint32_t i_1;
  uint32_t end;
  uint32_t begin;
  uint32_t i;
  uint32_t block_pos;
  value_type *in_stack_ffffffffffffffa8;
  DaTrie<true,_false,_true> *in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffcc;
  DaTrie<true,_false,_true> *in_stack_ffffffffffffffd0;
  uint local_10;
  uint32_t local_c;
  
  local_c = num_blocks((DaTrie<true,_false,_true> *)0x177538);
  for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
    in_stack_ffffffffffffffb0 = (DaTrie<true,_false,_true> *)&stack0xffffffffffffffe8;
    Bc::Bc((Bc *)in_stack_ffffffffffffffb0);
    std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::push_back
              (&in_stack_ffffffffffffffb0->bc_,in_stack_ffffffffffffffa8);
    Bc::~Bc((Bc *)&stack0xffffffffffffffe8);
  }
  __x = (value_type *)(in_RDI + 0x30);
  memset(&stack0xffffffffffffffcc,0,0x10);
  BlockLink::BlockLink((BlockLink *)&stack0xffffffffffffffcc);
  std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::push_back
            ((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_stack_ffffffffffffffb0,
             __x);
  uVar1 = local_c * 0x100;
  uVar2 = uVar1 + 0x100;
  for (; uVar1 < uVar2; uVar1 = uVar1 + 1) {
    set_next_(in_stack_ffffffffffffffb0,(uint32_t)((ulong)__x >> 0x20),(uint32_t)__x);
    set_prev_(in_stack_ffffffffffffffb0,(uint32_t)((ulong)__x >> 0x20),(uint32_t)__x);
  }
  push_block_(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
              (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)CONCAT44(uVar2,uVar1));
  *(int *)(in_RDI + 100) = *(int *)(in_RDI + 100) + 0x100;
  return;
}

Assistant:

void push_block_() {
    auto block_pos = num_blocks();

    for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
      bc_.push_back(Bc{});
    }
    if (WithNLM) {
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        node_links_.push_back(NodeLink{});
      }
    }
    blocks_.push_back(BlockType{});

    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;

    for (auto i = begin; i < end; ++i) {
      set_next_(i, i + 1);
      set_prev_(i, i - 1);
    }

    push_block_(block_pos, blocks_);
    bc_emps_ += BLOCK_SIZE;
  }